

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  ImDrawCmd *pIVar1;
  ImVec2 IVar2;
  ImGuiViewportP *pIVar3;
  ImDrawList *this;
  ImDrawCmd *pIVar4;
  ImVec2 cr_max;
  long lVar5;
  ImRect viewport_rect;
  ImDrawCmd cmd;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImDrawCmd local_58;
  
  if (0xffffff < col) {
    pIVar3 = *(GImGui->Viewports).Data;
    local_68.x = (pIVar3->super_ImGuiViewport).Pos.x;
    local_68.y = (pIVar3->super_ImGuiViewport).Pos.y;
    IVar2 = (pIVar3->super_ImGuiViewport).Size;
    IStack_60.x = IVar2.x + local_68.x;
    IStack_60.y = IVar2.y + local_68.y;
    this = window->RootWindow->DrawList;
    if ((this->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(this);
    }
    IVar2.y = local_68.y + -1.0;
    IVar2.x = local_68.x + -1.0;
    cr_max.y = IStack_60.y + 1.0;
    cr_max.x = IStack_60.x + 1.0;
    ImDrawList::PushClipRect(this,IVar2,cr_max,false);
    ImDrawList::AddRectFilled(this,&local_68,&IStack_60,col,0.0,0);
    pIVar4 = (this->CmdBuffer).Data;
    lVar5 = (long)(this->CmdBuffer).Size;
    local_58.UserCallbackData = pIVar4[lVar5 + -1].UserCallbackData;
    pIVar1 = pIVar4 + lVar5 + -1;
    local_58.ClipRect.x = (pIVar1->ClipRect).x;
    local_58.ClipRect.y = (pIVar1->ClipRect).y;
    local_58.ClipRect.z = (pIVar1->ClipRect).z;
    local_58.ClipRect.w = (pIVar1->ClipRect).w;
    local_58.TextureId = pIVar4[lVar5 + -1].TextureId;
    local_58._24_8_ = (&pIVar4[lVar5 + -1].TextureId)[1];
    pIVar4 = pIVar4 + lVar5 + -1;
    local_58.ElemCount = pIVar4->ElemCount;
    local_58._36_4_ = *(undefined4 *)&pIVar4->field_0x24;
    local_58.UserCallback = *(ImDrawCallback *)(&pIVar4->ElemCount + 2);
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + -1;
    ImVector<ImDrawCmd>::push_front(&this->CmdBuffer,&local_58);
    ImDrawList::PopClipRect(this);
    ImDrawList::AddDrawCmd(this);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }
}